

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

uint __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
::bubbleDown(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Lhs>_>
             *this,uint index)

{
  Binding *pBVar1;
  uint uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  Binding *pBVar9;
  uint uVar10;
  Binding *pBVar11;
  ulong uVar12;
  
  uVar8 = (ulong)index;
  do {
    while( true ) {
      uVar2 = (uint)uVar8;
      uVar3 = uVar2 * 2;
      if (this->_size < uVar3) {
        return uVar2;
      }
      pBVar9 = this->_data1;
      pBVar1 = pBVar9 + uVar8;
      if (uVar3 != this->_size) break;
      uVar10 = pBVar1->var;
LAB_002f2f7f:
      if (pBVar9[uVar3].var <= uVar10) {
        return uVar2;
      }
      pBVar11 = pBVar9 + uVar3;
      pBVar1 = pBVar9 + uVar8;
      uVar2 = pBVar1->var;
      uVar7 = *(undefined4 *)&pBVar1->field_0x4;
      uVar4 = (pBVar1->term)._content;
      uVar6 = *(undefined4 *)&pBVar11->field_0x4;
      uVar5 = (pBVar11->term)._content;
      pBVar9 = pBVar9 + uVar8;
      pBVar9->var = pBVar11->var;
      *(undefined4 *)&pBVar9->field_0x4 = uVar6;
      (pBVar9->term)._content = uVar5;
      pBVar11->var = uVar2;
      *(undefined4 *)&pBVar11->field_0x4 = uVar7;
      (pBVar11->term)._content = uVar4;
      uVar8 = (ulong)uVar3;
    }
    uVar12 = (ulong)(uVar3 | 1);
    uVar10 = pBVar1->var;
    if (pBVar9[uVar12].var <= uVar10) goto LAB_002f2f7f;
    if (pBVar9[uVar12].var < pBVar9[uVar3].var) {
      pBVar9 = pBVar9 + uVar3;
      uVar2 = pBVar1->var;
      uVar7 = *(undefined4 *)&pBVar1->field_0x4;
      uVar4 = (pBVar1->term)._content;
      uVar6 = *(undefined4 *)&pBVar9->field_0x4;
      uVar5 = (pBVar9->term)._content;
      pBVar1->var = pBVar9->var;
      *(undefined4 *)&pBVar1->field_0x4 = uVar6;
      (pBVar1->term)._content = uVar5;
      pBVar9->var = uVar2;
      *(undefined4 *)&pBVar9->field_0x4 = uVar7;
      (pBVar9->term)._content = uVar4;
      uVar8 = (ulong)uVar3;
    }
    else {
      pBVar9 = pBVar9 + uVar12;
      uVar2 = pBVar1->var;
      uVar7 = *(undefined4 *)&pBVar1->field_0x4;
      uVar4 = (pBVar1->term)._content;
      uVar6 = *(undefined4 *)&pBVar9->field_0x4;
      uVar5 = (pBVar9->term)._content;
      pBVar1->var = pBVar9->var;
      *(undefined4 *)&pBVar1->field_0x4 = uVar6;
      (pBVar1->term)._content = uVar5;
      pBVar9->var = uVar2;
      *(undefined4 *)&pBVar9->field_0x4 = uVar7;
      (pBVar9->term)._content = uVar4;
      uVar8 = uVar12;
    }
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }